

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

void end_examples(audit_regressor_data *d)

{
  void *pvVar1;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x38))();
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x40))();
  if (*(long **)(in_RDI + 0x28) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))();
  }
  *(undefined8 *)(in_RDI + 0x28) = 0;
  pvVar1 = *(void **)(in_RDI + 0x20);
  if (pvVar1 != (void *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(unaff_retaddr);
    operator_delete(pvVar1);
  }
  *(undefined8 *)(in_RDI + 0x20) = 0;
  return;
}

Assistant:

void end_examples(audit_regressor_data& d)
{
  d.out_file->flush();  // close_file() should do this for me ...
  d.out_file->close_file();
  delete (d.out_file);
  d.out_file = NULL;
  delete d.ns_pre;
  d.ns_pre = NULL;
}